

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall RPCHelpMan::ToString_abi_cxx11_(string *__return_storage_ptr__,RPCHelpMan *this)

{
  bool bVar1;
  RPCArg *pRVar2;
  pointer pcVar3;
  pointer pRVar4;
  bool bVar5;
  variant_alternative_t<0UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar6;
  void *pvVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pcVar15;
  pointer pRVar16;
  RPCArg *pRVar17;
  pointer pcVar18;
  RPCArg *pRVar19;
  long in_FS_OFFSET;
  bool bVar20;
  Sections named_only_sections;
  Sections sections;
  ulong local_140;
  Section local_138;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar11 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(this->m_name)._M_dataplus._M_p,(this->m_name)._M_string_length)
  ;
  pRVar17 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar2 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar17 != pRVar2) {
    bVar5 = false;
    do {
      pRVar19 = pRVar17 + 1;
      bVar1 = (pRVar17->m_opts).hidden;
      if (bVar1 == false) {
        bVar20 = true;
        if (*(__index_type *)
             ((long)&(pRVar17->m_fallback).
                     super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                     .
                     super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
             + 0x58) == '\0') {
          pvVar6 = std::get<0ul,RPCArg::Optional,std::__cxx11::string,UniValue>
                             (&pRVar17->m_fallback);
          bVar20 = *pvVar6 != NO;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__," ");
        if (bVar20) {
          bVar20 = !bVar5;
          bVar5 = true;
          if (bVar20) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,"( ");
          }
        }
        else {
          if (bVar5) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,") ");
          }
          bVar5 = false;
        }
        ::RPCArg::ToString_abi_cxx11_(&local_138.m_left,pRVar17,true);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
                   local_138.m_left._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
          operator_delete(local_138.m_left._M_dataplus._M_p,
                          local_138.m_left.field_2._M_allocated_capacity + 1);
        }
      }
    } while ((bVar1 == false) && (pRVar17 = pRVar19, pRVar19 != pRVar2));
    if (bVar5) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__," )");
    }
  }
  pcVar3 = (this->m_description)._M_dataplus._M_p;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this->m_description)._M_string_length;
  pcVar15 = (pointer)0xffffffffffffffff;
  local_98._M_dataplus._M_p = (pointer)paVar12;
  local_98._M_string_length = (size_type)pcVar3;
  if (paVar12 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pcVar18 = (pointer)0x0;
    do {
      pvVar7 = memchr(" \f\n\r\t\v",(int)pcVar3[(long)pcVar18],6);
      pcVar15 = pcVar18;
      if (pvVar7 == (void *)0x0) break;
      pcVar18 = pcVar18 + 1;
      pcVar15 = (pointer)0xffffffffffffffff;
    } while (paVar12 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar18);
  }
  if (pcVar15 == (pointer)0xffffffffffffffff) {
    uVar14 = 0;
    pcVar15 = (pointer)0x0;
  }
  else {
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_98," \f\n\r\t\v",
                       0xffffffffffffffff,6);
    if (local_98._M_dataplus._M_p < pcVar15) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar10 = std::__throw_out_of_range_fmt
                           ("%s: __pos (which is %zu) > __size (which is %zu)",
                            "basic_string_view::substr",pcVar15);
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar11) {
          operator_delete(pcVar3,paVar11->_M_allocated_capacity + 1);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar10);
        }
      }
      goto LAB_00d8e6ca;
    }
    uVar14 = (sVar8 - (long)pcVar15) + 1;
    if ((ulong)((long)local_98._M_dataplus._M_p - (long)pcVar15) < uVar14) {
      uVar14 = (long)local_98._M_dataplus._M_p - (long)pcVar15;
    }
    pcVar15 = pcVar15 + local_98._M_string_length;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar15,pcVar15 + uVar14);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_78,0,0,"\n\n",2);
  local_58._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar11) {
    local_58.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(ulong *)((long)&pbVar9->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_58._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"\n");
  paVar11 = &local_138.m_left.field_2;
  local_138.m_left._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar12 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p == paVar12) {
    local_138.m_left.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_138.m_left.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_138.m_left._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_138.m_left.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_138.m_left._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar11) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  pRVar16 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar16) {
    uVar14 = 0;
    do {
      if (pRVar16[uVar14].m_opts.hidden != false) break;
      uVar13 = uVar14 + 1;
      local_140 = uVar13;
      util::ToString<unsigned_long>(&local_b8,&local_140);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8,". ");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar9->_M_dataplus)._M_p;
      paVar12 = &pbVar9->field_2;
      if (paVar11 == paVar12) {
        local_98.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_98._M_dataplus._M_p = (pointer)paVar11;
      }
      pRVar17 = pRVar16 + uVar14;
      local_98._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      ::RPCArg::GetFirstName_abi_cxx11_(&local_d8,pRVar17);
      uVar10 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar10 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < (pointer)(local_98._M_string_length + local_d8._M_string_length)) {
        uVar10 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar10 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < (pointer)(local_98._M_string_length + local_d8._M_string_length))
        goto LAB_00d8df5a;
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_d8,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
      }
      else {
LAB_00d8df5a:
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_98,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      }
      local_138.m_left._M_dataplus._M_p = (pointer)&local_138.m_left.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar9->_M_dataplus)._M_p;
      paVar11 = &pbVar9->field_2;
      if (paVar12 == paVar11) {
        local_138.m_left.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_138.m_left.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      }
      else {
        local_138.m_left.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_138.m_left._M_dataplus._M_p = (pointer)paVar12;
      }
      local_138.m_left._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar9->_M_string_length = 0;
      paVar11->_M_local_buf[0] = '\0';
      ::RPCArg::ToDescriptionString_abi_cxx11_(&local_f8,pRVar17,true);
      std::vector<Section,std::allocator<Section>>::
      emplace_back<std::__cxx11::string,std::__cxx11::string>
                ((vector<Section,std::allocator<Section>> *)&local_58,&local_138.m_left,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
        operator_delete(local_138.m_left._M_dataplus._M_p,
                        local_138.m_left.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        (ulong)(local_98.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar10 = *(ulong *)(local_58._M_string_length + -0x38);
      if (*(ulong *)(local_58._M_string_length + -0x38) < (ulong)local_58.field_2._8_8_) {
        uVar10 = local_58.field_2._8_8_;
      }
      local_58.field_2._8_8_ = uVar10;
      Sections::Push((Sections *)&local_58,pRVar17,5,NONE);
      if (pRVar17->m_type == OBJ_NAMED_PARAMS) {
        pRVar4 = (pRVar17->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar16 = (pRVar17->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                       _M_impl.super__Vector_impl_data._M_start; pRVar16 != pRVar4;
            pRVar16 = pRVar16 + 1) {
          ::RPCArg::GetFirstName_abi_cxx11_(&local_98,pRVar16);
          ::RPCArg::ToDescriptionString_abi_cxx11_(&local_b8,pRVar16,true);
          Section::Section(&local_138,&local_98,&local_b8);
          uVar10 = local_138.m_left._M_string_length;
          if (local_138.m_left._M_string_length < (ulong)local_78.field_2._8_8_) {
            uVar10 = local_78.field_2._8_8_;
          }
          local_78.field_2._8_8_ = uVar10;
          std::vector<Section,_std::allocator<Section>_>::push_back
                    ((vector<Section,_std::allocator<Section>_> *)&local_78,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.m_right._M_dataplus._M_p != &local_138.m_right.field_2) {
            operator_delete(local_138.m_right._M_dataplus._M_p,
                            local_138.m_right.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
            operator_delete(local_138.m_left._M_dataplus._M_p,
                            local_138.m_left.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            (ulong)(local_98.field_2._M_allocated_capacity + 1));
          }
          Sections::Push((Sections *)&local_78,pRVar16,5,NONE);
        }
      }
      pRVar16 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = uVar13;
    } while (uVar13 < (ulong)(((long)(this->m_args).
                                     super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pRVar16 >> 3) *
                             0xf83e0f83e0f83e1));
  }
  paVar11 = &local_138.m_left.field_2;
  if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\nArguments:\n");
  }
  Sections::ToString_abi_cxx11_(&local_138.m_left,(Sections *)&local_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar11) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\nNamed Arguments:\n");
  }
  Sections::ToString_abi_cxx11_(&local_138.m_left,(Sections *)&local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar11) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  RPCResults::ToDescriptionString_abi_cxx11_(&local_138.m_left,&this->m_results);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar11) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  RPCExamples::ToDescriptionString_abi_cxx11_(&local_138.m_left,&this->m_examples);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar11) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  std::vector<Section,_std::allocator<Section>_>::~vector
            ((vector<Section,_std::allocator<Section>_> *)&local_78);
  std::vector<Section,_std::allocator<Section>_>::~vector
            ((vector<Section,_std::allocator<Section>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00d8e6ca:
  __stack_chk_fail();
}

Assistant:

std::string RPCHelpMan::ToString() const
{
    std::string ret;

    // Oneline summary
    ret += m_name;
    bool was_optional{false};
    for (const auto& arg : m_args) {
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden
        const bool optional = arg.IsOptional();
        ret += " ";
        if (optional) {
            if (!was_optional) ret += "( ";
            was_optional = true;
        } else {
            if (was_optional) ret += ") ";
            was_optional = false;
        }
        ret += arg.ToString(/*oneline=*/true);
    }
    if (was_optional) ret += " )";

    // Description
    ret += "\n\n" + TrimString(m_description) + "\n";

    // Arguments
    Sections sections;
    Sections named_only_sections;
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg = m_args.at(i);
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden

        // Push named argument name and description
        sections.m_sections.emplace_back(util::ToString(i + 1) + ". " + arg.GetFirstName(), arg.ToDescriptionString(/*is_named_arg=*/true));
        sections.m_max_pad = std::max(sections.m_max_pad, sections.m_sections.back().m_left.size());

        // Recursively push nested args
        sections.Push(arg);

        // Push named-only argument sections
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& arg_inner : arg.m_inner) {
                named_only_sections.PushSection({arg_inner.GetFirstName(), arg_inner.ToDescriptionString(/*is_named_arg=*/true)});
                named_only_sections.Push(arg_inner);
            }
        }
    }

    if (!sections.m_sections.empty()) ret += "\nArguments:\n";
    ret += sections.ToString();
    if (!named_only_sections.m_sections.empty()) ret += "\nNamed Arguments:\n";
    ret += named_only_sections.ToString();

    // Result
    ret += m_results.ToDescriptionString();

    // Examples
    ret += m_examples.ToDescriptionString();

    return ret;
}